

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::TriaO2::Jacobian(MatrixXd *__return_storage_ptr__,TriaO2 *this,MatrixXd *local)

{
  TriaO2 *pTVar1;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  undefined8 uVar2;
  runtime_error *this_01;
  double *pdVar3;
  long lVar4;
  NestedExpressionType pMVar5;
  bool bVar6;
  Index row;
  long lVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  MatrixXd tmp;
  MatrixXd local_reversed;
  stringstream ss;
  scalar_product_op<double,_double> local_2f9;
  TriaO2 *local_2f8;
  undefined1 local_2f0 [32];
  variable_if_dynamic<long,__1> local_2d0;
  variable_if_dynamic<long,__1> vStack_2c8;
  Index local_2c0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_2b8;
  undefined1 local_298 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_288;
  variable_if_dynamic<long,__1> vStack_270;
  Index local_268;
  variable_if_dynamic<long,__1> local_260;
  undefined1 local_250 [40];
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_228;
  Matrix<double,__1,_2,_0,__1,_2> *local_220;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_218;
  Rhs local_200;
  Lhs local_1e8;
  Lhs local_1d0;
  undefined1 local_1b8 [24];
  scalar_constant_op<double> local_1a0;
  RhsNested local_198;
  
  local_2f0._0_8_ = (long *)0x0;
  local_228 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__;
  local_200.m_matrix.m_expression = (NestedExpressionType)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_298,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_2f0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_1b8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_298,(Rhs *)&local_200,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_2f0);
  lVar4 = ((local_198.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar4) {
    pdVar3 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar10 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar6 = false;
    lVar7 = 0;
    do {
      if (0 < lVar10) {
        lVar9 = 0;
        do {
          if (pdVar3[lVar9] < local_1a0.m_other) goto LAB_00382242;
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      lVar7 = lVar7 + 1;
      pdVar3 = pdVar3 + lVar10;
      bVar6 = lVar4 <= lVar7;
    } while (lVar7 != lVar4);
LAB_00382242:
    if (!bVar6) goto LAB_003825bf;
  }
  local_250._0_8_ = &DAT_3ff0000000000000;
  local_2b8.m_storage.m_data = (double *)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_2f0,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_250);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_298,(Lhs *)&local_2b8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_2f0,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_250);
  if (0 < (long)local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data) {
    lVar4 = *(long *)local_298._0_8_;
    bVar6 = false;
    dVar8 = 0.0;
    do {
      if (0 < (long)local_298._8_8_) {
        lVar10 = 0;
        do {
          if ((double)local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows < *(double *)(lVar4 + lVar10 * 8)) goto LAB_003822ed;
          lVar10 = lVar10 + 1;
        } while (local_298._8_8_ != lVar10);
      }
      dVar8 = (double)((long)dVar8 + 1);
      lVar4 = lVar4 + *(Index *)(local_298._0_8_ + 8) * 8;
      bVar6 = (long)local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data <= (long)dVar8;
    } while ((double *)dVar8 !=
             local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
LAB_003822ed:
    if (!bVar6) {
LAB_003825bf:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "local coordinates out of bounds for reference element",0x35);
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_298,(string *)local_2f0,0x42,(string *)local_250);
      if ((NestedExpressionType)local_250._0_8_ != (NestedExpressionType)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
      }
      if ((Matrix<double,__1,__1,_0,__1,__1> *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,
                        (long)local_288.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data + 1);
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"this code should not be reached");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_2b8.m_storage.m_data = (double *)0x0;
  local_2b8.m_storage.m_rows = 0;
  local_2b8.m_storage.m_cols = 0;
  local_2f8 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_2b8,
             (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
             .m_rows,(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols * 2);
  if (0 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
     ) {
    local_220 = &local_2f8->gamma_x_2_;
    lVar4 = 0;
    do {
      local_250._0_8_ = local_220;
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_2f0,
                 local,lVar4);
      local_260.m_value = *(Index *)(local_250._0_8_ + 8);
      local_298._0_8_ = local_2f0._0_8_;
      local_298._8_8_ = local_2f0._8_8_;
      local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)local_2f0._16_8_;
      local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_2f0._24_8_;
      local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_2d0.m_value;
      vStack_270.m_value = vStack_2c8.m_value;
      local_268 = local_2c0;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>,_-1,_1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
                       *)local_1b8,(Lhs *)local_250,(Rhs *)local_298,
                      (scalar_product_op<double,_double> *)&local_200);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_298,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_2b8,0,lVar4 * 2,
                 local_2b8.m_storage.m_rows,2);
      uVar2 = local_1b8._8_8_;
      pdVar3 = (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1b8._0_8_)->
               m_storage).m_data;
      lVar10 = (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1b8._0_8_)->
               m_storage).m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,2,0,_1,2>const>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>,_1,1>const>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_298,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
                  *)local_1b8,(assign_op<double,_double> *)&local_200);
      if (0 < (long)local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data) {
        lVar7 = *(Index *)(local_288.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows + 8);
        dVar8 = 0.0;
        pMVar5 = (NestedExpressionType)local_298._0_8_;
        do {
          if (0 < (long)local_298._8_8_) {
            lVar9 = 0;
            do {
              *(double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data + lVar9 * 8) =
                   *(double *)(uVar2 + (long)dVar8 * 8) * pdVar3[lVar9];
              lVar9 = lVar9 + 1;
            } while (local_298._8_8_ != lVar9);
          }
          dVar8 = (double)((long)dVar8 + 1);
          pdVar3 = pdVar3 + lVar10;
          pMVar5 = (NestedExpressionType)
                   ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           ).m_storage.m_data + lVar7 * 8);
        } while ((double *)dVar8 !=
                 local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols);
  }
  local_1b8._0_8_ = local;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_218,
             (DenseBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)
             local_1b8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_218,1,
             (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols * (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows);
  pTVar1 = local_2f8;
  local_1d0.m_matrix = &local_2f8->beta_;
  local_1d0.m_colFactor.m_value =
       (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_1d0.m_rowFactor.m_value = 1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   *)local_250,&local_1d0,(Rhs *)&local_2b8,
                  (scalar_sum_op<double,_double> *)local_298);
  local_1e8.m_expression.m_rowFactor.m_value =
       (pTVar1->delta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows;
  local_200.m_matrix.m_expression = &pTVar1->delta_;
  local_1e8.m_expression.m_colFactor.m_value = 1;
  local_200.m_colFactor.m_value = local_218.m_storage.m_cols;
  local_1e8.m_expression.m_matrix = (MatrixTypeNested)&local_218;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>
                   *)local_2f0,&local_1e8,&local_200,&local_2f9);
  this_00 = local_228;
  local_298._0_8_ = local_2f0._0_8_;
  local_298._8_8_ = local_2f0._8_8_;
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)local_2f0._16_8_;
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_2f0._24_8_;
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_2d0.m_value;
  vStack_270.m_value = vStack_2c8.m_value;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_250,(Rhs *)local_298,
                  (scalar_sum_op<double,_double> *)&local_200);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,1,_1>const>>const>>
            (this_00,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>_>
                      *)local_1b8);
  free(local_218.m_storage.m_data);
  free(local_2b8.m_storage.m_data);
  return (MatrixXd *)this_00;
}

Assistant:

Eigen::MatrixXd TriaO2::Jacobian(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  Eigen::MatrixXd tmp(gamma_.rows(), 2 * local.cols());

  for (long i = 0; i < local.cols(); ++i) {
    tmp.block(0, 2 * i, tmp.rows(), 2) =
        gamma_x_2_.array().rowwise() * local.col(i).transpose().array();
  }

  Eigen::MatrixXd local_reversed = local.colwise().reverse();
  local_reversed.resize(1, local.size());

  return beta_.replicate(1, local.cols()) + tmp +
         (local_reversed.replicate(delta_.rows(), 1).array().colwise() *
          delta_.array())
             .matrix();
}